

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O3

string * __thiscall
cmLinkLineComputer::ComputeLinkLibs_abi_cxx11_
          (string *__return_storage_ptr__,cmLinkLineComputer *this,cmComputeLinkInformation *cli)

{
  pointer pIVar1;
  TargetType TVar2;
  ItemVector *pIVar3;
  OutputFormat output;
  pointer pIVar4;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pIVar3 = cmComputeLinkInformation::GetItems(cli);
  pIVar4 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar4 != pIVar1) {
    do {
      if (pIVar4->Target == (cmGeneratorTarget *)0x0) {
LAB_002d3d56:
        if (pIVar4->IsPath == true) {
          (*this->_vptr_cmLinkLineComputer[2])(&local_50,this,pIVar4);
          output = (OutputFormat)this->UseWatcomQuote;
          if (this->ForResponse != false) {
            output = RESPONSE;
          }
          cmOutputConverter::ConvertToOutputFormat(&local_70,this->OutputConverter,&local_50,output)
          ;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)(pIVar4->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        TVar2 = cmGeneratorTarget::GetType(pIVar4->Target);
        if (TVar2 != INTERFACE_LIBRARY) goto LAB_002d3d56;
      }
      pIVar4 = pIVar4 + 1;
    } while (pIVar4 != pIVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ComputeLinkLibs(cmComputeLinkInformation& cli)
{
  std::string linkLibs;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    if (item.IsPath) {
      linkLibs +=
        this->ConvertToOutputFormat(this->ConvertToLinkReference(item.Value));
    } else {
      linkLibs += item.Value;
    }
    linkLibs += " ";
  }
  return linkLibs;
}